

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP5Deserializer::BreakdownFieldType
          (BP5Deserializer *this,char *FieldType,bool *Operator,bool *MinMax)

{
  runtime_error *this_00;
  undefined1 *in_RCX;
  undefined1 *in_RDX;
  char *in_RSI;
  char *local_10;
  
  if (*in_RSI == 'M') {
    local_10 = in_RSI + 9;
    if (local_10 != (char *)0x0) {
      if (*local_10 == 'O') {
        *in_RDX = 1;
        local_10 = in_RSI + 0xb;
      }
      if (*local_10 == 'M') {
        *in_RCX = 1;
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"BP5 unable to parse metadata, likely old version");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BP5Deserializer::BreakdownFieldType(const char *FieldType, bool &Operator, bool &MinMax)
{
    if (FieldType[0] != 'M')
    {
        throw std::runtime_error("BP5 unable to parse metadata, likely old version");
    }

    // should start with "MetaArray"
    FieldType += strlen("MetaArray");
    if (FieldType == 0)
        return;
    if (FieldType[0] == 'O')
    {
        Operator = true;
        FieldType += strlen("Op");
    }
    if (FieldType[0] == 'M')
    {
        MinMax = true;
    }
}